

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void DrawGrid(void)

{
  int iVar1;
  float fVar2;
  
  glPushMatrix();
  glDisable(0xb44);
  glTranslatef(0,0,0x43130000);
  iVar1 = 0;
  do {
    fVar2 = (float)iVar1 * 26.25 + -157.5;
    glBegin(9);
    glColor3f(0x3f19999a,0x3dcccccd,0x3f19999a);
    glVertex3f(fVar2 + 2.0,0x431d8000,0xc2200000);
    glVertex3f(fVar2,0x431d8000,0xc2200000);
    glVertex3f(fVar2,0xc31f8000,0xc2200000);
    glVertex3f(fVar2 + 2.0,0xc31f8000,0xc2200000);
    glEnd();
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xd);
  iVar1 = 0;
  do {
    fVar2 = (float)iVar1 * -26.25 + 157.5;
    glBegin(9);
    glColor3f(0x3f19999a,0x3dcccccd,0x3f19999a);
    glVertex3f(0x431f8000,fVar2,0xc2200000);
    glVertex3f(0xc31d8000,fVar2,0xc2200000);
    glVertex3f(0xc31d8000,fVar2 + -2.0,0xc2200000);
    glVertex3f(0x431f8000,fVar2 + -2.0,0xc2200000);
    glEnd();
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xd);
  glPopMatrix();
  return;
}

Assistant:

void DrawGrid( void )
{
   int              row, col;
   const int        rowTotal    = 12;                   /* must be divisible by 2 */
   const int        colTotal    = rowTotal;             /* must be same as rowTotal */
   const GLfloat    widthLine   = 2.0;                  /* should be divisible by 2 */
   const GLfloat    sizeCell    = GRID_SIZE / rowTotal;
   const GLfloat    z_offset    = -40.0;
   GLfloat          xl, xr;
   GLfloat          yt, yb;

   glPushMatrix();
   glDisable( GL_CULL_FACE );

  /*
   * Another relative Z translation to separate objects.
   */
   glTranslatef( 0.0, 0.0, DIST_BALL );

  /*
   * Draw vertical lines (as skinny 3D rectangles).
   */
   for ( col = 0; col <= colTotal; col++ )
   {
     /*
      * Compute co-ords of line.
      */
      xl = -GRID_SIZE / 2 + col * sizeCell;
      xr = xl + widthLine;

      yt =  GRID_SIZE / 2;
      yb = -GRID_SIZE / 2 - widthLine;

      glBegin( GL_POLYGON );

      glColor3f( 0.6f, 0.1f, 0.6f );               /* purple */

      glVertex3f( xr, yt, z_offset );       /* NE */
      glVertex3f( xl, yt, z_offset );       /* NW */
      glVertex3f( xl, yb, z_offset );       /* SW */
      glVertex3f( xr, yb, z_offset );       /* SE */

      glEnd();
   }

  /*
   * Draw horizontal lines (as skinny 3D rectangles).
   */
   for ( row = 0; row <= rowTotal; row++ )
   {
     /*
      * Compute co-ords of line.
      */
      yt = GRID_SIZE / 2 - row * sizeCell;
      yb = yt - widthLine;

      xl = -GRID_SIZE / 2;
      xr =  GRID_SIZE / 2 + widthLine;

      glBegin( GL_POLYGON );

      glColor3f( 0.6f, 0.1f, 0.6f );               /* purple */

      glVertex3f( xr, yt, z_offset );       /* NE */
      glVertex3f( xl, yt, z_offset );       /* NW */
      glVertex3f( xl, yb, z_offset );       /* SW */
      glVertex3f( xr, yb, z_offset );       /* SE */

      glEnd();
   }

   glPopMatrix();

   return;
}